

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

TValue * luaH_set(lua_State *L,Table *t,TValue *key)

{
  TValue *p;
  TValue *key_local;
  Table *t_local;
  lua_State *L_local;
  
  L_local = (lua_State *)luaH_get(t,key);
  t->flags = '\0';
  if (L_local == (lua_State *)&luaO_nilobject_) {
    if (key->tt == 0) {
      luaG_runerror(L,"table index is nil");
    }
    else if ((key->tt == 3) &&
            (((key->value).n != (key->value).n || (NAN((key->value).n) || NAN((key->value).n))))) {
      luaG_runerror(L,"table index is NaN");
    }
    L_local = (lua_State *)newkey(L,t,key);
  }
  return (TValue *)L_local;
}

Assistant:

static TValue*luaH_set(lua_State*L,Table*t,const TValue*key){
const TValue*p=luaH_get(t,key);
t->flags=0;
if(p!=(&luaO_nilobject_))
return cast(TValue*,p);
else{
if(ttisnil(key))luaG_runerror(L,"table index is nil");
else if(ttisnumber(key)&&luai_numisnan(nvalue(key)))
luaG_runerror(L,"table index is NaN");
return newkey(L,t,key);
}
}